

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O2

void __thiscall
cmExportCommand::StorePackageRegistryDir
          (cmExportCommand *this,string *package,char *content,char *hash)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string fname;
  string local_408;
  ostringstream e;
  cmGeneratedFileStream entry;
  
  pcVar2 = cmsys::SystemTools::GetEnv("HOME");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&fname,pcVar2,(allocator *)&entry);
    cmsys::SystemTools::ConvertToUnixSlashes(&fname);
    std::__cxx11::string::append((char *)&fname);
    std::__cxx11::string::append((string *)&fname);
    cmsys::SystemTools::MakeDirectory(fname._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&fname);
    std::__cxx11::string::append((char *)&fname);
    bVar1 = cmsys::SystemTools::FileExists(fname._M_dataplus._M_p);
    if (!bVar1) {
      cmGeneratedFileStream::cmGeneratedFileStream(&entry,fname._M_dataplus._M_p,true);
      if (((&entry.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)entry.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]] & 5) == 0) {
        poVar3 = std::operator<<((ostream *)&entry,content);
        std::operator<<(poVar3,"\n");
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,"Cannot create package registry file:\n");
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = std::operator<<(poVar3,(string *)&fname);
        poVar3 = std::operator<<(poVar3,"\n");
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        poVar3 = std::operator<<(poVar3,(string *)&local_408);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_408);
        this_00 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,WARNING,&local_408,false);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream(&entry);
    }
    std::__cxx11::string::~string((string *)&fname);
  }
  return;
}

Assistant:

void cmExportCommand::StorePackageRegistryDir(std::string const& package,
                                              const char* content,
                                              const char* hash)
{
#if defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) !=
      B_OK)
    {
    return;
    }
  std::string fname = dir;
  fname += "/cmake/packages/";
  fname += package;
#else
  const char* home = cmSystemTools::GetEnv("HOME");
  if(!home)
    {
    return;
    }
  std::string fname = home;
  cmSystemTools::ConvertToUnixSlashes(fname);
  fname += "/.cmake/packages/";
  fname += package;
#endif
  cmSystemTools::MakeDirectory(fname.c_str());
  fname += "/";
  fname += hash;
  if(!cmSystemTools::FileExists(fname.c_str()))
    {
    cmGeneratedFileStream entry(fname.c_str(), true);
    if(entry)
      {
      entry << content << "\n";
      }
    else
      {
      std::ostringstream e;
      e << "Cannot create package registry file:\n"
        << "  " << fname << "\n"
        << cmSystemTools::GetLastSystemError() << "\n";
      this->Makefile->IssueMessage(cmake::WARNING, e.str());
      }
    }
}